

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYWriter::PLYWriter(PLYWriter *this)

{
  (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ofstream::ofstream(&this->out);
  this->enc = ply_little_endian;
  this->header_complete = false;
  this->element = (PLYElement *)0x0;
  this->pelem = 0;
  this->pinst = 0;
  this->pprop = 0;
  this->plist = 0;
  return;
}

Assistant:

PLYWriter::PLYWriter()
{
  enc=ply_little_endian;
  header_complete=false;
  element=0;
  pelem=0;
  pinst=0;
  pprop=0;
  plist=0;
}